

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_vp8e_entropy.c
# Opt level: O0

RK_S32 vp8e_calc_cost_mv(RK_S32 mvd,RK_S32 *mv_prob)

{
  int iVar1;
  RK_S32 RVar2;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_20;
  RK_S32 tmp;
  RK_S32 bit_cost;
  RK_S32 i;
  RK_S32 *mv_prob_local;
  RK_S32 mvd_local;
  
  local_28 = mvd >> 1;
  if (local_28 < 0) {
    local_28 = -local_28;
  }
  if (local_28 < 8) {
    iVar1 = vp8_prob_cost_tbl[*mv_prob];
    RVar2 = get_cost_tree(mv_tree_tbl + local_28,mv_prob + 2);
    mv_prob_local._4_4_ = RVar2 + iVar1;
    if (local_28 != 0) {
      if (mvd < 0) {
        local_2c = vp8_prob_cost_tbl[0xff - mv_prob[1]];
      }
      else {
        local_2c = vp8_prob_cost_tbl[mv_prob[1]];
      }
      mv_prob_local._4_4_ = local_2c + mv_prob_local._4_4_;
    }
  }
  else {
    local_20 = vp8_prob_cost_tbl[0xff - *mv_prob];
    for (tmp = 0; tmp < 3; tmp = tmp + 1) {
      if ((local_28 >> ((byte)tmp & 0x1f) & 1U) == 0) {
        local_30 = vp8_prob_cost_tbl[mv_prob[tmp + 9]];
      }
      else {
        local_30 = vp8_prob_cost_tbl[0xff - mv_prob[tmp + 9]];
      }
      local_20 = local_30 + local_20;
    }
    for (tmp = 9; 3 < tmp; tmp = tmp + -1) {
      if ((local_28 >> ((byte)tmp & 0x1f) & 1U) == 0) {
        local_34 = vp8_prob_cost_tbl[mv_prob[tmp + 9]];
      }
      else {
        local_34 = vp8_prob_cost_tbl[0xff - mv_prob[tmp + 9]];
      }
      local_20 = local_34 + local_20;
    }
    if (0xf < local_28) {
      if ((local_28 >> 3 & 1U) == 0) {
        local_38 = vp8_prob_cost_tbl[mv_prob[0xc]];
      }
      else {
        local_38 = vp8_prob_cost_tbl[0xff - mv_prob[0xc]];
      }
      local_20 = local_38 + local_20;
    }
    if (mvd < 0) {
      local_3c = vp8_prob_cost_tbl[0xff - mv_prob[1]];
    }
    else {
      local_3c = vp8_prob_cost_tbl[mv_prob[1]];
    }
    mv_prob_local._4_4_ = local_3c + local_20;
  }
  return mv_prob_local._4_4_;
}

Assistant:

RK_S32 vp8e_calc_cost_mv(RK_S32 mvd, RK_S32 *mv_prob)
{
    RK_S32 i = 0;
    RK_S32 bit_cost = 0;

    RK_S32 tmp = MPP_ABS(mvd >> 1);

    if (tmp < 8) {
        bit_cost += COST_BOOL(mv_prob[0], 0);
        bit_cost += get_cost_tree(&mv_tree_tbl[tmp], mv_prob + 2);
        if (!tmp)
            return bit_cost;

        /* Sign */
        bit_cost += COST_BOOL(mv_prob[1], mvd < 0);
        return bit_cost;
    }

    bit_cost += COST_BOOL(mv_prob[0], 1);

    for (i = 0; i < 3; i++) {
        bit_cost += COST_BOOL(mv_prob[9 + i], (tmp >> i) & 1);
    }

    for (i = 9; i > 3; i--) {
        bit_cost += COST_BOOL(mv_prob[9 + i], (tmp >> i) & 1);
    }

    if (tmp > 15) {
        bit_cost += COST_BOOL(mv_prob[9 + 3], (tmp >> 3) & 1);
    }

    bit_cost += COST_BOOL(mv_prob[1], mvd < 0);

    return bit_cost;
}